

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QColorListView.cpp
# Opt level: O0

int __thiscall QColorListView::qt_metacall(QColorListView *this,Call _c,int _id,void **_a)

{
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  QObject *in_stack_00000020;
  undefined4 local_18;
  undefined4 local_4;
  
  local_18 = QListView::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  local_4 = local_18;
  if (-1 < local_18) {
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_00000020,this._4_4_,(int)this,(void **)CONCAT44(_c,_id));
      local_18 = local_18 + -2;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QColorListView::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QListView::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    
#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}